

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O3

void qsoundc_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  short *psVar2;
  short *psVar3;
  size_t __n;
  int iVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  undefined2 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  short sVar12;
  short sVar13;
  undefined2 uVar14;
  ushort *puVar15;
  short sVar16;
  undefined2 uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined2 uVar21;
  INT16 (*paIVar22) [95];
  long lVar23;
  char cVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  undefined2 uVar28;
  uint uVar29;
  undefined2 uVar30;
  short sVar32;
  long lVar31;
  int iVar33;
  long lVar34;
  bool bVar35;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0) {
    uVar20 = 0;
    do {
      uVar6 = *(ushort *)((long)param + 0x1490);
      if (uVar6 < 0x314) {
        if (uVar6 == 0x39) {
          lVar34 = 0;
          bVar5 = true;
          do {
            bVar35 = bVar5;
            lVar34 = lVar34 * 0x188;
            *(undefined8 *)((long)param + lVar34 + 0xcb8) = 0x5f;
            uVar6 = *(ushort *)((long)param + lVar34 + 0xcc0);
            if ((uVar6 - 0xf2e & 0xffff) < 0xd1) {
              paIVar22 = (INT16 (*) [95])(qsound_filter_data2 + (uVar6 - 0xf2e));
LAB_0016c589:
              memcpy((void *)((long)param + lVar34 + 0xcc2),paIVar22,0xbe);
            }
            else if ((ushort)(uVar6 - 0xcf5) < 0x239) {
              iVar9 = (uint)uVar6 + (int)((ulong)((long)(int)(uVar6 - 0xd53) * -0x53896e7b) >> 0x20)
                      + -0xd53;
              paIVar22 = qsound_filter_data + (uint)((iVar9 >> 6) - (iVar9 >> 0x1f));
              goto LAB_0016c589;
            }
            lVar34 = 1;
            bVar5 = false;
          } while (bVar35);
          *(undefined4 *)((long)param + 0x1490) = 0x3140314;
        }
        else {
          if (uVar6 != 0x4f) goto LAB_0016c4d8;
          lVar34 = 0;
          bVar5 = true;
          do {
            bVar35 = bVar5;
            lVar34 = lVar34 * 0x188;
            *(undefined8 *)((long)param + lVar34 + 0xcb8) = 0x2d;
            uVar6 = *(ushort *)((long)param + lVar34 + 0xcc0);
            if ((uVar6 - 0xf2e & 0xffff) < 0xd1) {
              paIVar22 = (INT16 (*) [95])(qsound_filter_data2 + (uVar6 - 0xf2e));
LAB_0016c261:
              memcpy((void *)((long)param + lVar34 + 0xcc2),paIVar22,0x5a);
            }
            else if ((ushort)(uVar6 - 0xcf5) < 0x239) {
              iVar9 = (uint)uVar6 + (int)((ulong)((long)(int)(uVar6 - 0xd53) * -0x53896e7b) >> 0x20)
                      + -0xd53;
              paIVar22 = qsound_filter_data + (uint)((iVar9 >> 6) - (iVar9 >> 0x1f));
              goto LAB_0016c261;
            }
            *(undefined8 *)((long)param + lVar34 + 0xfc8) = 0x2c;
            uVar6 = *(ushort *)((long)param + lVar34 + 0xfd0);
            if ((uVar6 - 0xf2e & 0xffff) < 0xd1) {
              paIVar22 = (INT16 (*) [95])(qsound_filter_data2 + (uVar6 - 0xf2e));
LAB_0016c2f2:
              memcpy((void *)((long)param + lVar34 + 0xfd2),paIVar22,0x58);
            }
            else if ((ushort)(uVar6 - 0xcf5) < 0x239) {
              iVar9 = (uint)uVar6 + (int)((ulong)((long)(int)(uVar6 - 0xd53) * -0x53896e7b) >> 0x20)
                      + -0xd53;
              paIVar22 = qsound_filter_data + (uint)((iVar9 >> 6) - (iVar9 >> 0x1f));
              goto LAB_0016c2f2;
            }
            lVar34 = 1;
            bVar5 = false;
          } while (bVar35);
          *(undefined4 *)((long)param + 0x1490) = 0x6b206b2;
        }
      }
      else if ((uVar6 == 0x314) || (uVar6 == 0x6b2)) {
        sVar12 = -0x554;
        if (uVar6 == 0x6b2) {
          sVar12 = -0x53c;
        }
        *(undefined1 *)((long)param + 0x149c) = 0x80;
        sVar12 = sVar12 + *(short *)((long)param + 0x4ae);
        lVar34 = 0;
        sVar25 = 0;
        if (0 < sVar12) {
          sVar25 = sVar12;
        }
        if (0x3ff < sVar25) {
          sVar25 = 0x400;
        }
        *(short *)((long)param + 0x4b2) = sVar25;
        uVar27 = *(uint *)((long)param + 0x18);
        lVar23 = 0;
        iVar9 = 0;
        do {
          uVar26 = 0;
          if ((uVar27 >> ((uint)lVar23 & 0x1f) & 1) == 0) {
            uVar6 = *(ushort *)((long)param + lVar34 + 0x332);
            uVar7 = *(ushort *)((long)param + lVar34 + 0x334);
            if (((short)uVar6 < 0) && (uVar26 = 0, *(int *)((long)param + 0x14) != 0)) {
              uVar26 = (uint)(short)((ushort)*(byte *)(*(long *)((long)param + 8) +
                                                      ((ulong)((uVar6 & 0x7fff) << 0x10) |
                                                      (ulong)uVar7)) << 8);
            }
            uVar29 = (uint)(*(ushort *)((long)param + lVar34 + 0x336) >> 4) +
                     (uint)*(ushort *)((long)param + lVar34 + 0x338) + (short)uVar7 * 0x1000;
            if ((int)*(short *)((long)param + lVar34 + 0x33c) <= (int)uVar29 >> 0xc) {
              uVar29 = uVar29 + *(short *)((long)param + lVar34 + 0x33a) * -0x1000;
            }
            uVar26 = uVar26 * (int)*(short *)((long)param + lVar34 + 0x33e) >> 0xe;
            iVar9 = iVar9 + (int)*(short *)((long)param + lVar34 + 0x340) * (int)(short)uVar26 * 4;
            if ((int)uVar29 < -0x7ffffff) {
              uVar29 = 0xf8000000;
            }
            if (0x7fffffe < (int)uVar29) {
              uVar29 = 0x7ffffff;
            }
            *(short *)((long)param + lVar34 + 0x334) = (short)(uVar29 >> 0xc);
            *(short *)((long)param + lVar34 + 0x336) = (short)(uVar29 << 4);
          }
          *(short *)((long)param + lVar23 * 2 + 0x488) = (short)uVar26;
          lVar23 = lVar23 + 1;
          lVar34 = lVar34 + 0x10;
        } while (lVar23 != 0x10);
        iVar4 = *(int *)((long)param + 0x1498);
        uVar26 = iVar4 % 3 + 0x10;
        uVar19 = (ulong)uVar26;
        if ((uVar27 >> (uVar26 & 0x1f) & 1) == 0) {
          puVar15 = (ushort *)((long)param + (long)(iVar4 % 3) * 0x10 + 0x432);
          if (iVar4 + 2U < 5) {
            uVar6 = puVar15[7];
            if (uVar6 == puVar15[1]) {
              puVar15[5] = 0;
            }
            if (puVar15[4] != 0) {
              *(undefined2 *)((long)param + uVar19 * 2 + 0x488) = 0;
              puVar15[4] = 0;
              puVar15[6] = 10;
              uVar6 = *puVar15;
              puVar15[5] = puVar15[3];
              puVar15[7] = uVar6;
            }
            cVar24 = '\0';
            if (((short)puVar15[2] < 0) && (*(int *)((long)param + 0x14) != 0)) {
              cVar24 = *(char *)(*(long *)((long)param + 8) +
                                ((ulong)uVar6 | (ulong)((puVar15[2] & 0x7fff) << 0x10)));
            }
          }
          else {
            uVar6 = puVar15[7];
            puVar15[7] = uVar6 + 1;
            cVar24 = '\0';
            if (((short)puVar15[2] < 0) && (*(int *)((long)param + 0x14) != 0)) {
              cVar24 = *(char *)(*(long *)((long)param + 8) +
                                ((ulong)((puVar15[2] & 0x7fff) << 0x10) | (ulong)uVar6)) << 4;
            }
          }
          iVar33 = (int)cVar24 >> 4;
          uVar27 = iVar33 * -2;
          if (iVar33 * -2 < 0) {
            uVar27 = iVar33 * 2;
          }
          uVar6 = puVar15[6];
          iVar11 = (int)((uVar27 | 1) * (int)(short)uVar6) >> 1;
          iVar10 = -iVar11;
          if (0 < iVar33) {
            iVar10 = iVar11;
          }
          iVar10 = *(short *)((long)param + uVar19 * 2 + 0x488) + iVar10;
          if (iVar10 < -0x7fff) {
            iVar10 = -0x8000;
          }
          if (0x7ffe < iVar10) {
            iVar10 = 0x7fff;
          }
          *(short *)((long)param + uVar19 * 2 + 0x488) =
               (short)((uint)((short)puVar15[5] * iVar10) >> 0x10);
          uVar7 = (ushort)((uint)((int)adpcm_step_table[iVar33 + 8] * (int)(short)uVar6) >> 6);
          uVar6 = uVar7;
          if ((short)uVar7 < 1) {
            uVar6 = 1;
          }
          if (2000 < (short)uVar7) {
            uVar6 = 2000;
          }
          puVar15[6] = uVar6;
        }
        else {
          *(undefined2 *)((long)param + uVar19 * 2 + 0x488) = 0;
        }
        sVar12 = *(short *)((long)param + 0xcb6);
        sVar25 = *(short *)((long)param + (long)sVar12 * 2 + 0x4b6);
        sVar32 = *(short *)((long)param + 0x4b4);
        *(short *)((long)param + 0x4b4) = sVar25;
        iVar33 = (int)sVar32 + (int)sVar25 >> 1;
        *(short *)((long)param + 0xcb6) = sVar12 + 1;
        *(short *)((long)param + (long)sVar12 * 2 + 0x4b6) =
             (short)((uint)(iVar9 + *(short *)((long)param + 0x4b0) * iVar33 * 4) >> 0x10);
        if (*(short *)((long)param + 0x4b2) <= *(short *)((long)param + 0xcb6)) {
          *(undefined2 *)((long)param + 0xcb6) = 0;
        }
        uVar26 = iVar33 << 0xe;
        lVar34 = 0;
        uVar27 = 0;
        bVar5 = true;
        do {
          bVar35 = bVar5;
          uVar29 = 0;
          if (bVar35) {
            uVar29 = uVar26;
          }
          lVar31 = lVar34 * 0x188;
          lVar23 = -0x26;
          do {
            uVar6 = *(short *)((long)param + lVar23 + 0x488) - 0x110;
            if (0x60 < uVar6) {
              uVar6 = 0x61;
            }
            iVar9 = (int)*(short *)((long)param + lVar23 + 0x4ae);
            uVar29 = uVar29 - *(short *)((long)param + (ulong)uVar6 * 2 + lVar31 + 0x22) * iVar9;
            uVar27 = uVar27 - *(short *)((long)param + (ulong)uVar6 * 2 + lVar31 + 0xe6) * iVar9;
            lVar23 = lVar23 + 2;
          } while (lVar23 != 0);
          if ((int)uVar29 < -0x1ffffffe) {
            uVar29 = 0xe0000001;
          }
          if (0x1ffffffe < (int)uVar29) {
            uVar29 = 0x1fffffff;
          }
          if ((int)uVar27 < -0x1ffffffe) {
            uVar27 = 0xe0000001;
          }
          if (0x1ffffffe < (int)uVar27) {
            uVar27 = 0x1fffffff;
          }
          iVar9 = *(int *)((long)param + lVar31 + 0xcb8);
          uVar1 = iVar9 - 1;
          uVar19 = (ulong)uVar1;
          if (iVar9 < 2) {
            iVar9 = *(int *)((long)param + lVar31 + 0xcbc);
            iVar33 = 0;
            uVar19 = 0;
          }
          else {
            iVar9 = *(int *)((long)param + lVar31 + 0xcbc);
            uVar18 = 0;
            iVar33 = 0;
            do {
              iVar10 = iVar9 + 1;
              iVar33 = iVar33 + (int)*(short *)((long)param + (long)iVar9 * 2 + lVar31 + 0xd80) *
                                (int)*(short *)((long)param + uVar18 * 2 + lVar31 + 0xcc2) * -4;
              iVar9 = iVar10;
              if ((int)uVar1 <= iVar10) {
                iVar9 = 0;
              }
              uVar18 = uVar18 + 1;
            } while (uVar19 != uVar18);
          }
          sVar12 = *(short *)((long)param + uVar19 * 2 + lVar31 + 0xcc2);
          *(int *)((long)param + lVar31 + 0xcbc) = iVar9 + 1;
          sVar25 = (short)(uVar27 >> 0xe);
          *(short *)((long)param + (long)iVar9 * 2 + lVar31 + 0xd80) = sVar25;
          if ((int)uVar1 <= iVar9 + 1) {
            *(undefined4 *)((long)param + lVar31 + 0xcbc) = 0;
          }
          if (*(short *)((long)param + 0x1490) == 0x6b2) {
            iVar9 = *(int *)((long)param + lVar31 + 0xfc8);
            uVar27 = iVar9 - 1;
            uVar19 = (ulong)uVar27;
            if (iVar9 < 2) {
              iVar9 = *(int *)((long)param + lVar31 + 0xfcc);
              iVar10 = 0;
              uVar19 = 0;
            }
            else {
              iVar9 = *(int *)((long)param + lVar31 + 0xfcc);
              uVar18 = 0;
              iVar10 = 0;
              do {
                iVar11 = iVar9 + 1;
                iVar10 = iVar10 + (int)*(short *)((long)param + (long)iVar9 * 2 + lVar31 + 0x1090) *
                                  (int)*(short *)((long)param + uVar18 * 2 + lVar31 + 0xfd2) * -4;
                iVar9 = iVar11;
                if ((int)uVar27 <= iVar11) {
                  iVar9 = 0;
                }
                uVar18 = uVar18 + 1;
              } while (uVar19 != uVar18);
            }
            sVar32 = *(short *)((long)param + uVar19 * 2 + lVar31 + 0xfd2);
            *(int *)((long)param + lVar31 + 0xfcc) = iVar9 + 1;
            sVar13 = (short)(uVar29 >> 0xe);
            *(short *)((long)param + (long)iVar9 * 2 + lVar31 + 0x1090) = sVar13;
            if ((int)uVar27 <= iVar9 + 1) {
              *(undefined4 *)((long)param + lVar31 + 0xfcc) = 0;
            }
            sVar32 = (short)((uint)(iVar10 + (int)sVar13 * (int)sVar32 * -4) >> 0x10);
          }
          else {
            sVar32 = (short)((uVar29 << 2) >> 0x10);
          }
          lVar23 = lVar34 * 0x6e;
          psVar2 = (short *)((long)param + lVar23 + 0x12d8);
          sVar13 = *(short *)((long)param + lVar23 + 0x12dc);
          *(short *)((long)param + lVar23 + 0x12dc) = sVar13 + 1;
          psVar2[(long)sVar13 + 4] =
               (short)((uint)(iVar33 + (int)sVar25 * (int)sVar12 * -4) >> 0x10);
          if (0x32 < *(short *)((long)param + lVar23 + 0x12dc)) {
            psVar2[2] = 0;
          }
          sVar12 = psVar2[3];
          sVar13 = sVar12 + 1;
          psVar2[3] = sVar13;
          sVar12 = psVar2[(long)sVar12 + 4];
          sVar25 = psVar2[1];
          if (0x32 < sVar13) {
            sVar13 = 0;
          }
          psVar2[3] = sVar13;
          psVar3 = (short *)((long)param + lVar23 + 0x13b4);
          sVar13 = *(short *)((long)param + lVar23 + 0x13b8);
          *(short *)((long)param + lVar23 + 0x13b8) = sVar13 + 1;
          psVar3[(long)sVar13 + 4] = sVar32;
          sVar32 = *(short *)((long)param + lVar23 + 0x13b8);
          if (0x32 < sVar32) {
            psVar3[2] = 0;
            sVar32 = 0;
          }
          sVar13 = psVar3[3];
          sVar16 = sVar13 + 1;
          psVar3[3] = sVar16;
          if (0x32 < sVar16) {
            sVar16 = 0;
          }
          iVar9 = (int)sVar25 * (int)sVar12 + (int)psVar3[1] * (int)psVar3[(long)sVar13 + 4] +
                  0x2000 >> 0xe;
          if (iVar9 < -0x7ffe) {
            iVar9 = -0x7fff;
          }
          uVar8 = (undefined2)iVar9;
          if (0x7ffe < iVar9) {
            uVar8 = 0x7fff;
          }
          psVar3[3] = sVar16;
          *(undefined2 *)((long)param + lVar34 * 2 + 0x1e) = uVar8;
          if (*(short *)((long)param + 0x1494) != 0) {
            iVar9 = (int)psVar2[2] - (int)*psVar2;
            sVar12 = (short)iVar9 + 0x33 + (short)(iVar9 / 0x33) * -0x33;
            if (-1 < iVar9 % 0x33) {
              sVar12 = (short)(iVar9 % 0x33);
            }
            psVar2[3] = sVar12;
            iVar9 = (int)sVar32 - (int)*psVar3;
            sVar12 = (short)iVar9 + 0x33 + (short)(iVar9 / 0x33) * -0x33;
            if (-1 < iVar9 % 0x33) {
              sVar12 = (short)(iVar9 % 0x33);
            }
            psVar3[3] = sVar12;
          }
          lVar34 = 1;
          uVar27 = uVar26;
          bVar5 = false;
        } while (bVar35);
        *(undefined2 *)((long)param + 0x1494) = 0;
        *(int *)((long)param + 0x1498) = iVar4 + 1;
        if (4 < iVar4) goto LAB_0016cb2c;
      }
      else {
LAB_0016c4d8:
        if (*(int *)((long)param + 0x1498) < 2) {
          if (*(int *)((long)param + 0x1498) == 1) {
            *(undefined4 *)((long)param + 0x1498) = 2;
          }
          else {
            memset((void *)((long)param + 0x332),0,0x130);
            memset((void *)((long)param + 0x4b0),0,0xfe0);
            lVar34 = -0x26;
            do {
              *(undefined2 *)((long)param + lVar34 + 0x488) = 0x120;
              *(undefined2 *)((long)param + lVar34 + 0x4ae) = 0;
              lVar34 = lVar34 + 2;
            } while (lVar34 != 0);
            lVar34 = 0;
            do {
              *(undefined2 *)((long)param + 0x332 + lVar34) = 0x8000;
              lVar34 = lVar34 + 0x10;
            } while (lVar34 != 0x100);
            *(undefined2 *)((long)param + 0x436) = 0x8000;
            *(undefined2 *)((long)param + 0x446) = 0x8000;
            *(undefined2 *)((long)param + 0x456) = 0x8000;
            if (uVar6 != 0x61a) {
              uVar8 = 0x39;
              uVar14 = 0x55a;
              uVar17 = 0xe11;
              uVar21 = 0xdb2;
              uVar30 = 0x30;
              uVar28 = 0x2e;
            }
            else {
              *(undefined2 *)((long)param + 0xfd0) = 0xf73;
              *(undefined2 *)((long)param + 0x1158) = 0xfa4;
              uVar8 = 0x4f;
              uVar14 = 0x542;
              uVar17 = 0xfa4;
              uVar21 = 0xf73;
              uVar28 = 0;
              uVar30 = 0;
            }
            *(ushort *)((long)param + 0x12d8) = (ushort)(uVar6 == 0x61a);
            *(undefined2 *)((long)param + 0x13b4) = uVar28;
            *(undefined4 *)((long)param + 0x1346) = 0x3fff0000;
            *(undefined2 *)((long)param + 0x1422) = uVar30;
            *(undefined2 *)((long)param + 0xcc0) = uVar21;
            *(undefined2 *)((long)param + 0xe48) = uVar17;
            *(undefined2 *)((long)param + 0x4ae) = uVar14;
            *(undefined2 *)((long)param + 0x1492) = uVar8;
            *(undefined2 *)((long)param + 0x12da) = 0x3fff;
            *(undefined2 *)((long)param + 0x13b6) = 0x3fff;
            *(undefined2 *)((long)param + 0x1424) = 0x3fff;
            *(undefined2 *)((long)param + 0x1494) = 1;
            *(undefined1 *)((long)param + 0x149c) = 0;
            *(undefined4 *)((long)param + 0x1498) = 1;
          }
        }
        else {
LAB_0016cb2c:
          *(undefined4 *)((long)param + 0x1498) = 0;
          *(undefined2 *)((long)param + 0x1490) = *(undefined2 *)((long)param + 0x1492);
        }
      }
      (*outputs)[uVar20] = (int)*(short *)((long)param + 0x1e);
      outputs[1][uVar20] = (int)*(short *)((long)param + 0x20);
      uVar20 = uVar20 + 1;
    } while (uVar20 != samples);
  }
  return;
}

Assistant:

static void qsoundc_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	struct qsound_chip* chip = (struct qsound_chip*)param;
	UINT32 curSmpl;
	
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		update_sample(chip);
		outputs[0][curSmpl] = chip->out[0];
		outputs[1][curSmpl] = chip->out[1];
	}
	
	return;
}